

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void __thiscall
iqxmlrpc::Server::schedule_response
          (Server *this,Response *resp,Server_connection *conn,Executor *exec)

{
  Packet *this_00;
  Response_header *this_01;
  allocator<char> local_69;
  string local_68;
  string resp_str;
  
  dump_response_abi_cxx11_(&resp_str,(iqxmlrpc *)resp,(Response *)conn);
  this_00 = (Packet *)operator_new(0x38);
  this_01 = (Response_header *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"OK",&local_69);
  http::Response_header::Response_header(this_01,200,&local_68);
  http::Packet::Packet(this_00,(Header *)this_01,&resp_str);
  std::__cxx11::string::~string((string *)&local_68);
  Server_connection::schedule_response(conn,this_00);
  std::__cxx11::string::~string((string *)&resp_str);
  if (exec != (Executor *)0x0) {
    (*exec->_vptr_Executor[1])(exec);
  }
  return;
}

Assistant:

void Server::schedule_response(
  const Response& resp, Server_connection* conn, Executor* exec )
{
  std::auto_ptr<Executor> executor_to_delete(exec);
  std::string resp_str = dump_response(resp);
  http::Packet *packet = new http::Packet(new http::Response_header(), resp_str);
  conn->schedule_response( packet );
}